

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidCustomNoName(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  CustomLayerParams *pCVar7;
  WeightParams *this_00;
  ostream *poVar8;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10040;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xc);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10040;
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"probs");
  pCVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_custom(this);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::Add
                      (&pCVar7->weights_);
  CoreML::Specification::WeightParams::set_float16value(this_00,"somebitshere");
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xfa2);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testInvalidCustomNoName() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_custom();

    // No name, should be invalids
    //    params->set_classname("CustomClassName");

    auto *weights = params->add_weights();
    weights->set_float16value("somebitshere");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}